

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemoPlayer.cpp
# Opt level: O3

void __thiscall DemoPlayer::play(DemoPlayer *this,uint songNumber)

{
  int iVar1;
  File *pFVar2;
  undefined4 extraout_var;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QString t;
  QString t_1;
  QString local_88;
  QArrayData *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  QArrayData *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  QArrayData *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  QArrayData *local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  QList<QMidiEvent>::clear(&(this->midiEventList).super_QVector<QMidiEvent>);
  if (songNumber < this->demoSongCount) {
    this->currentSongNumber = songNumber;
    pFVar2 = MT32Emu::ROMImage::getFile(this->controlROMImage);
    iVar1 = (*pFVar2->_vptr_File[3])(pFVar2);
    this->songData =
         (Bit8u *)(CONCAT44(extraout_var,iVar1) +
                   (ulong)*(ushort *)
                           (CONCAT44(extraout_var,iVar1) + (ulong)(songNumber * 2 + 0x86e0)) * 2 +
                  0x8000);
    local_28 = (QArrayData *)0x0;
    uStack_20 = 0;
    local_18 = 0;
    QString::setNum((ulonglong)&local_28,songNumber + 1);
    QVar3.m_data = (storage_type *)0x5;
    QVar3.m_size = (qsizetype)&local_70;
    QString::fromUtf8(QVar3);
    QString::append((QString *)&local_70);
    local_58 = local_70;
    local_50 = local_68;
    uStack_48 = uStack_60;
    if (local_70 != (QArrayData *)0x0) {
      LOCK();
      (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_70->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar4.m_data = (storage_type *)0x2;
    QVar4.m_size = (qsizetype)&local_88;
    QString::fromUtf8(QVar4);
    QString::append((QString *)&local_58);
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
      }
    }
    getSongName(&local_88,this->songData);
    local_40 = local_58;
    local_38 = local_50;
    uStack_30 = uStack_48;
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::append((QString *)&local_40);
    QString::operator=(&this->midiStreamName,(QString *)&local_40);
    if (local_40 != (QArrayData *)0x0) {
      LOCK();
      (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40,2,8);
      }
    }
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,8);
      }
    }
    if (local_70 != (QArrayData *)0x0) {
      LOCK();
      (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_70,2,8);
      }
    }
    if (local_28 != (QArrayData *)0x0) {
      LOCK();
      (local_28->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_28->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_28->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_28,2,8);
      }
    }
    this->midiTick = (ulong)*(ushort *)(this->songData + 0x10) * 2000;
    configureSynth(this);
    parseMIDIEvents(this,this->songData + 0x120);
    SMFDriver::start(&this->smfDriver,&this->super_MidiStreamSource);
  }
  return;
}

Assistant:

void DemoPlayer::play(uint songNumber) {
	midiEventList.clear();
	if (demoSongCount <= songNumber) return;
	currentSongNumber = songNumber;
	songData = getSongData(songNumber);
	midiStreamName = "Demo " + QString().setNum(songNumber + 1) + ": " + getSongName(songData);
	midiTick = computeMidiTick(songData);
	configureSynth();
	parseMIDIEvents(&songData[MIDI_STREAM_OFFSET]);
	smfDriver.start(this);
}